

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O3

void __thiscall QEglFSKmsGbmScreen::ensureModeSet(QEglFSKmsGbmScreen *this,uint32_t fb)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer p_Var6;
  drmModeAtomicReq *pdVar7;
  long in_FS_OFFSET;
  QArrayData *local_88;
  longlong local_80;
  QArrayData *local_70;
  undefined8 *local_68;
  char local_58 [24];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QKmsDevice::fd(*(QKmsDevice **)&this->field_0x28);
  if ((this->field_0x70 != '\x01') || (this->needsNewModeSetForNextFb == true)) {
    this->field_0x70 = 1;
    this->needsNewModeSetForNextFb = false;
    lVar5 = drmModeGetCrtc(iVar3,*(undefined4 *)&this->field_0x50);
    if (lVar5 != 0) {
      if (*(uint32_t *)(lVar5 + 4) == fb) {
        iVar4 = *(int *)&this->field_0x6c;
        p_Var6 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&this->field_0x80);
        iVar4 = bcmp((void *)(lVar5 + 0x1c),p_Var6 + iVar4,0x44);
        drmModeFreeCrtc(lVar5);
        if (iVar4 == 0) goto LAB_001135f0;
      }
      else {
        drmModeFreeCrtc(lVar5);
      }
    }
    lVar5 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar5 + 0x10) & 1) != 0) {
      local_40 = *(undefined8 *)(lVar5 + 8);
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      (**(code **)(*(long *)this + 0x90))(&local_88,this);
      QString::toLocal8Bit_helper((QChar *)&local_70,local_80);
      if (local_68 == (undefined8 *)0x0) {
        local_68 = &QByteArray::_empty;
      }
      QMessageLogger::debug(local_58,"Setting mode for screen %s",local_68);
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,1,0x10);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
    }
    bVar2 = QKmsDevice::hasAtomicSupport(*(QKmsDevice **)&this->field_0x28);
    if (bVar2) {
      pdVar7 = QKmsDevice::threadLocalAtomicRequest(*(QKmsDevice **)&this->field_0x28);
      if (pdVar7 != (drmModeAtomicReq *)0x0) {
        drmModeAtomicAddProperty
                  (pdVar7,*(undefined4 *)&this->field_0x48,*(undefined4 *)&this->field_0x108,
                   *(undefined4 *)&this->field_0x50);
        drmModeAtomicAddProperty
                  (pdVar7,*(undefined4 *)&this->field_0x50,*(undefined4 *)&this->field_0x10c,
                   *(undefined4 *)&this->field_0x114);
        drmModeAtomicAddProperty
                  (pdVar7,*(undefined4 *)&this->field_0x50,*(undefined4 *)&this->field_0x110,1);
      }
    }
    else {
      uVar1 = *(undefined4 *)&this->field_0x50;
      iVar4 = *(int *)&this->field_0x6c;
      p_Var6 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&this->field_0x80);
      iVar3 = drmModeSetCrtc(iVar3,uVar1,fb,0,0,&this->field_0x48,1,p_Var6 + iVar4);
      if (iVar3 == 0) {
        (**(code **)(*(long *)this + 200))(this,0);
      }
      else {
        ensureModeSet(this);
      }
    }
  }
LAB_001135f0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::ensureModeSet(uint32_t fb)
{
    QKmsOutput &op(output());
    const int fd = device()->fd();

    if (!op.mode_set || needsNewModeSetForNextFb) {
        op.mode_set = true;
        needsNewModeSetForNextFb = false;

        bool doModeSet = true;
        drmModeCrtcPtr currentMode = drmModeGetCrtc(fd, op.crtc_id);
        const bool alreadySet = currentMode && currentMode->buffer_id == fb && !memcmp(&currentMode->mode, &op.modes[op.mode], sizeof(drmModeModeInfo));
        if (currentMode)
            drmModeFreeCrtc(currentMode);
        if (alreadySet)
            doModeSet = false;

        if (doModeSet) {
            qCDebug(qLcEglfsKmsDebug, "Setting mode for screen %s", qPrintable(name()));

            if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
                drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
                if (request) {
                    drmModeAtomicAddProperty(request, op.connector_id, op.crtcIdPropertyId, op.crtc_id);
                    drmModeAtomicAddProperty(request, op.crtc_id, op.modeIdPropertyId, op.mode_blob_id);
                    drmModeAtomicAddProperty(request, op.crtc_id, op.activePropertyId, 1);
                }
#endif
            } else {
                int ret = drmModeSetCrtc(fd,
                                         op.crtc_id,
                                         fb,
                                         0, 0,
                                         &op.connector_id, 1,
                                         &op.modes[op.mode]);

                if (ret == 0)
                    setPowerState(PowerStateOn);
                else
                    qErrnoWarning(errno, "Could not set DRM mode for screen %s", qPrintable(name()));
            }
        }
    }
}